

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_union_type_vector
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser,
                 flatcc_json_parser_is_known_type_f *accept_type)

{
  long lVar1;
  char *pcVar2;
  flatbuffers_voffset_t id_00;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  void *pvVar5;
  flatbuffers_utype_t *pfVar6;
  char *pcVar7;
  size_t sVar8;
  void *__src;
  flatcc_builder_ref_t *pfVar9;
  undefined6 in_register_00000082;
  flatbuffers_utype_t fVar10;
  bool bVar11;
  flatbuffers_utype_t val;
  int more;
  size_t local_50;
  uint local_44;
  size_t local_40;
  long local_38;
  
  pvVar5 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  local_38 = union_index * 0x28;
  if (*(char *)((long)pvVar5 + local_38 + 0x24) == '\0') {
    local_44 = (uint)CONCAT62(in_register_00000082,id);
    *(undefined1 *)((long)pvVar5 + local_38 + 0x24) = 1;
    iVar3 = flatcc_builder_start_vector(ctx->ctx,1,1,0xffffffff);
    if (iVar3 == 0) {
      local_50 = (long)pvVar5 + local_38 + 0x10;
      local_40 = handle;
      buf = flatcc_json_parser_array_start(ctx,buf,end,&more);
      while (more != 0) {
        pfVar6 = (flatbuffers_utype_t *)flatcc_builder_extend_vector(ctx->ctx,1);
        if ((pfVar6 == (flatbuffers_utype_t *)0x0) ||
           ((pcVar7 = flatcc_json_parser_uint8(ctx,buf,end,&val), buf == pcVar7 &&
            ((pcVar7 = flatcc_json_parser_symbolic_uint8(ctx,pcVar7,end,type_parsers,&val),
             bVar11 = pcVar7 == buf, buf = pcVar7, bVar11 || (pcVar7 == end)))))) goto LAB_001115e2;
        fVar10 = val;
        iVar3 = (*accept_type)(val);
        if (iVar3 == 0) {
          if ((ctx->flags & 1) == 0) {
            if (ctx->error != 0) {
              return end;
            }
            ctx->error = 0xf;
            buf = pcVar7;
            goto LAB_001115f1;
          }
          val = '\0';
          fVar10 = '\0';
        }
        *pfVar6 = fVar10;
        buf = flatcc_json_parser_array_end(ctx,pcVar7,end,&more);
      }
      sVar8 = flatcc_builder_vector_count(ctx->ctx);
      *(flatbuffers_uoffset_t *)(local_50 + 0x18) = (flatbuffers_uoffset_t)sVar8;
      local_50 = flatcc_builder_enter_user_frame(ctx->ctx,sVar8 & 0xffffffff);
      pvVar5 = flatcc_builder_get_user_frame_ptr(ctx->ctx,local_50);
      __src = flatcc_builder_vector_edit(ctx->ctx);
      memcpy(pvVar5,__src,sVar8 & 0xffffffff);
      fVar4 = flatcc_builder_end_vector(ctx->ctx);
      if (fVar4 != 0) {
        id_00 = (flatbuffers_voffset_t)local_44;
        pfVar9 = flatcc_builder_table_add_offset(ctx->ctx,(local_44 & 0xffff) - 1);
        if (pfVar9 != (flatcc_builder_ref_t *)0x0) {
          *pfVar9 = fVar4;
          pvVar5 = flatcc_builder_get_user_frame_ptr(ctx->ctx,local_40);
          *(size_t *)((long)pvVar5 + local_38 + 0x30) = local_50;
          pcVar7 = *(char **)((long)pvVar5 + local_38 + 0x10);
          lVar1 = *(long *)((long)pvVar5 + 8);
          if (pcVar7 == (char *)0x0) {
            *(long *)((long)pvVar5 + 8) = lVar1 + 1;
            return buf;
          }
          if (lVar1 != 0) {
            *(long *)((long)pvVar5 + 8) = lVar1 + -1;
            iVar3 = ctx->line;
            pcVar2 = ctx->line_start;
            ctx->line = *(int *)((long)pvVar5 + local_38 + 0x20);
            ctx->line_start = *(char **)((long)pvVar5 + local_38 + 0x18);
            pcVar7 = _parse_union_vector(ctx,pcVar7,end,local_50,(flatbuffers_uoffset_t)sVar8,id_00,
                                         union_parser);
            if (pcVar7 == end) {
              return end;
            }
            ctx->line = iVar3;
            ctx->line_start = pcVar2;
            return buf;
          }
          __assert_fail("f->union_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                        ,0x4d8,
                        "const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *, flatcc_json_parser_is_known_type_f *)"
                       );
        }
      }
    }
LAB_001115e2:
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x23;
  }
  else {
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x1c;
  }
LAB_001115f1:
  ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = buf;
  return end;
}

Assistant:

const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser,
        flatcc_json_parser_is_known_type_f accept_type)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    const char *mark;
    int line;
    const char *line_start;
    int more;
    utype_t val;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    utype_t *types;
    size_t size;
    size_t h_types;
    uoffset_t count;

#if FLATBUFFERS_UTYPE_MAX != UINT8_MAX
#error "Update union vector parser to support current union type definition."
#endif

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) goto failed;
    buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
    while (more) {
        if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
        buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &val);
        if (mark == buf) {
            buf = flatcc_json_parser_symbolic_uint8(ctx, (mark = buf), end, type_parsers, &val);
            if (buf == mark || buf == end) goto failed;
        }
        /* Parse unknown types as NONE */
        if (!accept_type(val)) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
            }
            val = 0;
        }
        flatbuffers_uint8_write_to_pe(pval, val);
        buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
    }
    count = (uoffset_t)flatcc_builder_vector_count(ctx->ctx);
    e->count = count;
    size = count * utype_size;
    /* Store type vector so it is accessible to the table vector parser.  */
    h_types = flatcc_builder_enter_user_frame(ctx->ctx, size);
    types = flatcc_builder_get_user_frame_ptr(ctx->ctx, h_types);
    memcpy(types, flatcc_builder_vector_edit(ctx->ctx), size);
    if (!((ref = flatcc_builder_end_vector(ctx->ctx)))) goto failed;
    if (!(pref = flatcc_builder_table_add_offset(ctx->ctx, id - 1))) goto failed;
    *pref = ref;

    /* Restore union frame after possible invalidation due to types frame allocation. */
    f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    e = f->unions + union_index;

    e->h_types = h_types;
    if (e->backtrace == 0) {
        ++f->union_count;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    /* We must not assign buf here because we are backtracking. */
    if (end == _parse_union_vector(ctx, e->backtrace, end, h_types, count, id, union_parser)) return end;
    /*
     * NOTE: We do not need the user frame anymore, but if we did, it
     * would have to be restored from its handle due to the above parse.
     */
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}